

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedFieldWrapper<long>::Clear
          (RepeatedFieldWrapper<long> *this,Field *data)

{
  ulong uVar1;
  int iVar2;
  bool is_soo;
  
  uVar1 = *data;
  if ((uVar1 & 4) != 0) {
    LongSooRep::elements((LongSooRep *)data);
  }
  is_soo = (uVar1 & 4) == 0;
  SooRep::size((SooRep *)data,is_soo);
  iVar2 = SooRep::size((SooRep *)data,is_soo);
  if ((iVar2 != 0) && ((*data & 4) != 0)) {
    LongSooRep::elements((LongSooRep *)data);
  }
  RepeatedField<long>::set_size((RepeatedField<long> *)data,(uVar1 & 4) == 0,0);
  return;
}

Assistant:

void Clear(Field* data) const override {
    MutableRepeatedField(data)->Clear();
  }